

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink7.c
# Opt level: O3

Vec_Wrd_t * Unm_ManComputeTruths(Unm_Man_t *p)

{
  int *piVar1;
  Vec_Wrd_t *pVVar2;
  word *__ptr;
  Vec_Wrd_t *vTruths;
  word *__s;
  Vec_Int_t *pVVar3;
  word wVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  Gia_Man_t *p_00;
  long lVar11;
  int iVar12;
  ulong uVar13;
  
  pVVar3 = p->vUsed;
  uVar6 = pVVar3->nSize;
  uVar13 = (ulong)uVar6;
  pVVar2 = (Vec_Wrd_t *)malloc(0x10);
  if (uVar6 - 1 < 0xf) {
    uVar13 = 0x10;
  }
  pVVar2->nSize = 0;
  iVar12 = (int)uVar13;
  pVVar2->nCap = iVar12;
  if (iVar12 == 0) {
    __ptr = (word *)0x0;
  }
  else {
    __ptr = (word *)malloc((long)iVar12 << 3);
  }
  pVVar2->pArray = __ptr;
  iVar12 = p->pGia->nObjs;
  vTruths = (Vec_Wrd_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar12 - 1U) {
    iVar9 = iVar12;
  }
  vTruths->nCap = iVar9;
  if (iVar9 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar9 << 3);
  }
  vTruths->pArray = __s;
  vTruths->nSize = iVar12;
  memset(__s,0,(long)iVar12 << 3);
  if (0 < (int)uVar6) {
    uVar7 = 0;
    do {
      iVar12 = pVVar3->pArray[uVar7];
      lVar11 = (long)iVar12;
      if (lVar11 < 0) {
LAB_0071c66a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      p_00 = p->pGia;
      pVVar3 = p_00->vMapping;
      if (pVVar3->nSize <= iVar12) goto LAB_0071c66a;
      if (pVVar3->pArray[lVar11] == 0) {
        __assert_fail("Gia_ObjIsLut(p->pGia, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink7.c"
                      ,0xe7,"Vec_Wrd_t *Unm_ManComputeTruths(Unm_Man_t *)");
      }
      p->vLeaves->nSize = 0;
      uVar6 = pVVar3->nSize;
      if ((int)uVar6 <= iVar12) goto LAB_0071c66a;
      lVar10 = 0;
      while( true ) {
        piVar1 = pVVar3->pArray;
        lVar8 = (long)piVar1[lVar11];
        if ((lVar8 < 0) || (uVar6 <= (uint)piVar1[lVar11])) goto LAB_0071c66a;
        if (piVar1[lVar8] <= lVar10) break;
        Vec_IntPush(p->vLeaves,piVar1[lVar8 + lVar10 + 1]);
        lVar10 = lVar10 + 1;
        p_00 = p->pGia;
        pVVar3 = p_00->vMapping;
        uVar6 = pVVar3->nSize;
        if ((int)uVar6 <= iVar12) goto LAB_0071c66a;
      }
      if (6 < p->vLeaves->nSize) {
        __assert_fail("Vec_IntSize(p->vLeaves) <= 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink7.c"
                      ,0xec,"Vec_Wrd_t *Unm_ManComputeTruths(Unm_Man_t *)");
      }
      if (p_00->nObjs <= iVar12) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      wVar4 = Shr_ManComputeTruth6(p_00,p_00->pObjs + lVar11,p->vLeaves,vTruths);
      iVar12 = (int)uVar13;
      if ((int)uVar7 == iVar12) {
        if (iVar12 < 0x10) {
          if (__ptr == (word *)0x0) {
            __ptr = (word *)malloc(0x80);
          }
          else {
            __ptr = (word *)realloc(__ptr,0x80);
          }
          pVVar2->pArray = __ptr;
          uVar13 = 0x10;
        }
        else {
          uVar13 = (ulong)(uint)(iVar12 * 2);
          if (__ptr == (word *)0x0) {
            __ptr = (word *)malloc(uVar13 * 8);
          }
          else {
            __ptr = (word *)realloc(__ptr,uVar13 * 8);
          }
          pVVar2->pArray = __ptr;
        }
        if (__ptr == (word *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                        ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
        }
        pVVar2->nCap = (int)uVar13;
      }
      uVar5 = uVar7 & 0xffffffff;
      uVar7 = uVar7 + 1;
      pVVar2->nSize = (int)uVar7;
      __ptr[uVar5] = wVar4;
      pVVar3 = p->vUsed;
    } while ((long)uVar7 < (long)pVVar3->nSize);
    __s = vTruths->pArray;
  }
  if (__s != (word *)0x0) {
    free(__s);
  }
  free(vTruths);
  return pVVar2;
}

Assistant:

Vec_Wrd_t * Unm_ManComputeTruths( Unm_Man_t * p )
{
    Vec_Wrd_t * vTruthsTemp, * vTruths;
    int i, k, iObj, iNode;
    word uTruth;
    vTruths = Vec_WrdAlloc( Vec_IntSize(p->vUsed) );
    vTruthsTemp = Vec_WrdStart( Gia_ManObjNum(p->pGia) );
    Vec_IntForEachEntry( p->vUsed, iObj, i )
    {
        assert( Gia_ObjIsLut(p->pGia, iObj) );
        // collect leaves of this gate  
        Vec_IntClear( p->vLeaves );
        Gia_LutForEachFanin( p->pGia, iObj, iNode, k )
            Vec_IntPush( p->vLeaves, iNode );
        assert( Vec_IntSize(p->vLeaves) <= 6 );
        // compute truth table 
        uTruth = Shr_ManComputeTruth6( p->pGia, Gia_ManObj(p->pGia, iObj), p->vLeaves, vTruthsTemp );
        Vec_WrdPush( vTruths, uTruth );
//        if ( i % 100 == 0 )
//            Kit_DsdPrintFromTruth( (unsigned *)&uTruth, 6 ), printf( "\n" );
    }
    Vec_WrdFreeP( &vTruthsTemp );
    return vTruths;
}